

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O0

int blake2s_final(blake2s_state *S,void *out,size_t outlen)

{
  int iVar1;
  ulong local_50;
  size_t i;
  uint8_t buffer [32];
  size_t outlen_local;
  void *out_local;
  blake2s_state *S_local;
  
  buffer._24_8_ = outlen;
  memset(&i,0,0x20);
  if ((out == (void *)0x0) || ((ulong)buffer._24_8_ < S->outlen)) {
    S_local._4_4_ = -1;
  }
  else {
    iVar1 = blake2s_is_lastblock(S);
    if (iVar1 == 0) {
      blake2s_increment_counter(S,(uint32_t)S->buflen);
      blake2s_set_lastblock(S);
      memset(S->buf + S->buflen,0,0x40 - S->buflen);
      blake2s_compress(S,S->buf);
      for (local_50 = 0; local_50 < 8; local_50 = local_50 + 1) {
        store32(buffer + local_50 * 4 + -8,S->h[local_50]);
      }
      memcpy(out,&i,buffer._24_8_);
      secure_zero_memory(&i,0x20);
      S_local._4_4_ = 0;
    }
    else {
      S_local._4_4_ = -1;
    }
  }
  return S_local._4_4_;
}

Assistant:

int blake2s_final( blake2s_state *S, void *out, size_t outlen )
{
  uint8_t buffer[BLAKE2S_OUTBYTES] = {0};
  size_t i;

  if( out == NULL || outlen < S->outlen )
    return -1;

  if( blake2s_is_lastblock( S ) )
    return -1;

  blake2s_increment_counter( S, ( uint32_t )S->buflen );
  blake2s_set_lastblock( S );
  memset( S->buf + S->buflen, 0, BLAKE2S_BLOCKBYTES - S->buflen ); /* Padding */
  blake2s_compress( S, S->buf );

  for( i = 0; i < 8; ++i ) /* Output full hash to temp buffer */
    store32( buffer + sizeof( S->h[i] ) * i, S->h[i] );

  memcpy( out, buffer, outlen );
  secure_zero_memory(buffer, sizeof(buffer));
  return 0;
}